

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O2

aom_codec_err_t aom_codec_control(aom_codec_ctx_t *ctx,int ctrl_id,...)

{
  aom_codec_ctrl_fn_map_t_conflict *paVar1;
  char in_AL;
  aom_codec_err_t aVar2;
  aom_codec_control_fn_t_conflict *pp_Var3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  aVar2 = AOM_CODEC_INVALID_PARAM;
  if (ctx != (aom_codec_ctx_t *)0x0) {
    if (ctrl_id == 0) {
      ctx->err = AOM_CODEC_INVALID_PARAM;
    }
    else if (((ctx->iface == (aom_codec_iface_t *)0x0) || (ctx->priv == (aom_codec_priv_t *)0x0)) ||
            (paVar1 = ctx->iface->ctrl_maps, paVar1 == (aom_codec_ctrl_fn_map_t_conflict *)0x0)) {
      ctx->err = AOM_CODEC_ERROR;
LAB_0015e194:
      aVar2 = AOM_CODEC_ERROR;
    }
    else {
      pp_Var3 = &paVar1->fn;
      while( true ) {
        if ((((aom_codec_ctrl_fn_map_t_conflict *)(pp_Var3 + -1))->ctrl_id == 0) &&
           (*pp_Var3 == (aom_codec_control_fn_t_conflict)0x0)) {
          ctx->err = AOM_CODEC_ERROR;
          ctx->priv->err_detail = "Invalid control ID";
          goto LAB_0015e194;
        }
        if (((aom_codec_ctrl_fn_map_t_conflict *)(pp_Var3 + -1))->ctrl_id == ctrl_id) break;
        pp_Var3 = pp_Var3 + 2;
      }
      ap[0].reg_save_area = local_b8;
      ap[0].overflow_arg_area = &stack0x00000008;
      ap[0].gp_offset = 0x10;
      ap[0].fp_offset = 0x30;
      local_a8 = in_RDX;
      local_a0 = in_RCX;
      local_98 = in_R8;
      local_90 = in_R9;
      aVar2 = (**pp_Var3)((aom_codec_alg_priv_t_conflict *)ctx->priv,ap);
      ctx->err = aVar2;
    }
  }
  return aVar2;
}

Assistant:

aom_codec_err_t aom_codec_control(aom_codec_ctx_t *ctx, int ctrl_id, ...) {
  if (!ctx) {
    return AOM_CODEC_INVALID_PARAM;
  }
  // Control ID must be non-zero.
  if (!ctrl_id) {
    ctx->err = AOM_CODEC_INVALID_PARAM;
    return AOM_CODEC_INVALID_PARAM;
  }
  if (!ctx->iface || !ctx->priv || !ctx->iface->ctrl_maps) {
    ctx->err = AOM_CODEC_ERROR;
    return AOM_CODEC_ERROR;
  }

  // "ctrl_maps" is an array of (control ID, function pointer) elements,
  // with CTRL_MAP_END as a sentinel.
  for (aom_codec_ctrl_fn_map_t *entry = ctx->iface->ctrl_maps;
       !at_ctrl_map_end(entry); ++entry) {
    if (entry->ctrl_id == ctrl_id) {
      va_list ap;
      va_start(ap, ctrl_id);
      ctx->err = entry->fn((aom_codec_alg_priv_t *)ctx->priv, ap);
      va_end(ap);
      return ctx->err;
    }
  }
  ctx->err = AOM_CODEC_ERROR;
  ctx->priv->err_detail = "Invalid control ID";
  return AOM_CODEC_ERROR;
}